

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void internal_counters_mgga_next
               (xc_dimensions *dim,int offset,double **rho,double **sigma,double **lapl,double **tau
               ,double **zk,double **vrho,double **vsigma,double **vlapl,double **vtau,
               double **v2rho2,double **v2rhosigma,double **v2rholapl,double **v2rhotau,
               double **v2sigma2,double **v2sigmalapl,double **v2sigmatau,double **v2lapl2,
               double **v2lapltau,double **v2tau2,double **v3rho3,double **v3rho2sigma,
               double **v3rho2lapl,double **v3rho2tau,double **v3rhosigma2,double **v3rhosigmalapl,
               double **v3rhosigmatau,double **v3rholapl2,double **v3rholapltau,double **v3rhotau2,
               double **v3sigma3,double **v3sigma2lapl,double **v3sigma2tau,double **v3sigmalapl2,
               double **v3sigmalapltau,double **v3sigmatau2,double **v3lapl3,double **v3lapl2tau,
               double **v3lapltau2,double **v3tau3,double **v4rho4,double **v4rho3sigma,
               double **v4rho3lapl,double **v4rho3tau,double **v4rho2sigma2,double **v4rho2sigmalapl
               ,double **v4rho2sigmatau,double **v4rho2lapl2,double **v4rho2lapltau,
               double **v4rho2tau2,double **v4rhosigma3,double **v4rhosigma2lapl,
               double **v4rhosigma2tau,double **v4rhosigmalapl2,double **v4rhosigmalapltau,
               double **v4rhosigmatau2,double **v4rholapl3,double **v4rholapl2tau,
               double **v4rholapltau2,double **v4rhotau3,double **v4sigma4,double **v4sigma3lapl,
               double **v4sigma3tau,double **v4sigma2lapl2,double **v4sigma2lapltau,
               double **v4sigma2tau2,double **v4sigmalapl3,double **v4sigmalapl2tau,
               double **v4sigmalapltau2,double **v4sigmatau3,double **v4lapl4,double **v4lapl3tau,
               double **v4lapl2tau2,double **v4lapltau3,double **v4tau4)

{
  double **in_RCX;
  int in_ESI;
  long in_RDI;
  double **in_R8;
  double **in_R9;
  long *in_stack_00000010;
  double **in_stack_00000018;
  long *in_stack_00000020;
  long *in_stack_00000028;
  double **in_stack_00000030;
  double **in_stack_00000038;
  long *in_stack_00000040;
  long *in_stack_00000048;
  double **in_stack_00000050;
  long *in_stack_00000058;
  long *in_stack_00000060;
  long *in_stack_00000068;
  long *in_stack_00000070;
  long *in_stack_00000078;
  double **in_stack_00000080;
  double **in_stack_00000088;
  xc_dimensions *in_stack_000000d0;
  double **in_stack_ffffffffffffff70;
  
  internal_counters_gga_next
            (in_stack_000000d0,(int)((ulong)lapl >> 0x20),in_stack_00000088,in_stack_00000080,
             in_stack_00000050,in_stack_00000038,v2rho2,v2rhotau,v2tau2,v3rhotau2,
             in_stack_ffffffffffffff70,in_stack_00000018,in_stack_00000030,in_stack_00000038,
             in_stack_00000050,v3rhotau2,in_R9,in_R8,in_RCX);
  if (*in_R8 != (double *)0x0) {
    *in_R8 = *in_R8 + (*(int *)(in_RDI + 8) + in_ESI);
  }
  if (*in_R9 != (double *)0x0) {
    *in_R9 = *in_R9 + (*(int *)(in_RDI + 0xc) + in_ESI);
  }
  if (*in_stack_00000010 != 0) {
    if (*in_stack_00000020 != 0) {
      *in_stack_00000020 = *in_stack_00000020 + (long)(*(int *)(in_RDI + 0x1c) + in_ESI) * 8;
    }
    if (*in_stack_00000028 != 0) {
      *in_stack_00000028 = *in_stack_00000028 + (long)(*(int *)(in_RDI + 0x20) + in_ESI) * 8;
    }
  }
  if (*in_stack_00000030 != (double *)0x0) {
    if (*in_stack_00000068 != 0) {
      *in_stack_00000040 = *in_stack_00000040 + (long)(*(int *)(in_RDI + 0x2c) + in_ESI) * 8;
      *in_stack_00000058 = *in_stack_00000058 + (long)(*(int *)(in_RDI + 0x38) + in_ESI) * 8;
      *in_stack_00000068 = *in_stack_00000068 + (long)(*(int *)(in_RDI + 0x40) + in_ESI) * 8;
    }
    if (*in_stack_00000078 != 0) {
      *in_stack_00000048 = *in_stack_00000048 + (long)(*(int *)(in_RDI + 0x30) + in_ESI) * 8;
      *in_stack_00000060 = *in_stack_00000060 + (long)(*(int *)(in_RDI + 0x3c) + in_ESI) * 8;
      *in_stack_00000078 = *in_stack_00000078 + (long)(*(int *)(in_RDI + 0x48) + in_ESI) * 8;
    }
    if (*in_stack_00000070 != 0) {
      *in_stack_00000070 = *in_stack_00000070 + (long)(*(int *)(in_RDI + 0x44) + in_ESI) * 8;
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_mgga_next
  (const xc_dimensions *dim, int offset,
   const double **rho, const double **sigma, const double **lapl, const double **tau,
   double **zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_gga_next(dim, offset, rho, sigma, zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*lapl != NULL) *lapl += dim->lapl + offset;
  if(*tau != NULL)  *tau  += dim->tau  + offset;

#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) {
    if (*vlapl != NULL)
      *vlapl += dim->vlapl + offset;
    if (*vtau != NULL)
      *vtau  += dim->vtau  + offset;
  }

#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    if (*v2lapl2 != NULL){
      *v2rholapl   += dim->v2rholapl   + offset;
      *v2sigmalapl += dim->v2sigmalapl + offset;
      *v2lapl2     += dim->v2lapl2     + offset;
    }
    if (*v2tau2 != NULL){
      *v2rhotau    += dim->v2rhotau    + offset;
      *v2sigmatau  += dim->v2sigmatau  + offset;
      *v2tau2      += dim->v2tau2      + offset;
    }
    if (*v2lapltau != NULL){
      *v2lapltau   += dim->v2lapltau   + offset;
    }
  }

#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    if (*v3lapl3 != NULL){
      *v3rho2lapl     += dim->v3rho2lapl     + offset;
      *v3rhosigmalapl += dim->v3rhosigmalapl + offset;
      *v3rholapl2     += dim->v3rholapl2     + offset;
      *v3sigma2lapl   += dim->v3sigma2lapl   + offset;
      *v3sigmalapl2   += dim->v3sigmalapl2   + offset;
      *v3lapl3        += dim->v3lapl3        + offset;
    }
    if (*v3tau3 != NULL){
      *v3rho2tau      += dim->v3rho2tau      + offset;
      *v3rhosigmatau  += dim->v3rhosigmatau  + offset;
      *v3rhotau2      += dim->v3rhotau2      + offset;
      *v3sigma2tau    += dim->v3sigma2tau    + offset;
      *v3sigmatau2    += dim->v3sigmatau2    + offset;
      *v3tau3         += dim->v3tau3         + offset;
    }
    if(*v3rholapltau != NULL){
      *v3rholapltau   += dim->v3rholapltau   + offset;
      *v3sigmalapltau += dim->v3sigmalapltau + offset;
      *v3lapl2tau     += dim->v3lapl2tau     + offset;
      *v3lapltau2     += dim->v3lapltau2     + offset;
    }
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    if (*v4lapl4 != NULL){
      *v4rho3lapl        += dim->v4rho3lapl        + offset;
      *v4rho2sigmalapl   += dim->v4rho2sigmalapl   + offset;
      *v4rho2lapl2       += dim->v4rho2lapl2       + offset;
      *v4rhosigma2lapl   += dim->v4rhosigma2lapl   + offset;
      *v4rhosigmalapl2   += dim->v4rhosigmalapl2   + offset;
      *v4rholapl3        += dim->v4rholapl3        + offset;
      *v4sigma3lapl      += dim->v4sigma3lapl      + offset;
      *v4sigma2lapl2     += dim->v4sigma2lapl2     + offset;
      *v4sigmalapl3      += dim->v4sigmalapl3      + offset;
      *v4lapl4           += dim->v4lapl4           + offset;
    }
    if (*v4tau4 != NULL){
      *v4rho3tau         += dim->v4rho3tau         + offset;
      *v4rho2sigmatau    += dim->v4rho2sigmatau    + offset;
      *v4rho2tau2        += dim->v4rho2tau2        + offset;
      *v4rhosigma2tau    += dim->v4rhosigma2tau    + offset;
      *v4rhosigmatau2    += dim->v4rhosigmatau2    + offset;
      *v4rhotau3         += dim->v4rhotau3         + offset;
      *v4sigma3tau       += dim->v4sigma3tau       + offset;
      *v4sigma2tau2      += dim->v4sigma2tau2      + offset;
      *v4sigmatau3       += dim->v4sigmatau3       + offset;
      *v4tau4            += dim->v4tau4            + offset;
    }
    if(*v4rho2lapltau != NULL){
      *v4rho2lapltau     += dim->v4rho2lapltau     + offset;
      *v4rhosigmalapltau += dim->v4rhosigmalapltau + offset;
      *v4rholapl2tau     += dim->v4rholapl2tau     + offset;
      *v4rholapltau2     += dim->v4rholapltau2     + offset;
      *v4sigma2lapltau   += dim->v4sigma2lapltau   + offset;
      *v4sigmalapl2tau   += dim->v4sigmalapl2tau   + offset;
      *v4sigmalapltau2   += dim->v4sigmalapltau2   + offset;
      *v4lapl3tau        += dim->v4lapl3tau        + offset;
      *v4lapl2tau2       += dim->v4lapl2tau2       + offset;
      *v4lapltau3        += dim->v4lapltau3        + offset;
    }
  }
#endif
#endif
#endif
#endif
}